

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

unsigned_long_long __thiscall QPDFObjectHandle::getUIntValue(QPDFObjectHandle *this)

{
  allocator<char> local_41;
  string local_40;
  QPDFObjectHandle *local_20;
  longlong v;
  QPDFObjectHandle *this_local;
  
  v = (longlong)this;
  local_20 = (QPDFObjectHandle *)getIntValue(this);
  this_local = local_20;
  if ((long)local_20 < 0) {
    QTC::TC("qpdf","QPDFObjectHandle uint returning 0",0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"unsigned value request for negative number; returning 0",
               &local_41);
    warnIfPossible(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_local = (QPDFObjectHandle *)0x0;
  }
  return (unsigned_long_long)this_local;
}

Assistant:

unsigned long long
QPDFObjectHandle::getUIntValue() const
{
    long long v = getIntValue();
    if (v < 0) {
        QTC::TC("qpdf", "QPDFObjectHandle uint returning 0");
        warnIfPossible("unsigned value request for negative number; returning 0");
        return 0;
    } else {
        return static_cast<unsigned long long>(v);
    }
}